

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

void __thiscall
curlpp::FormParts::File::File(File *this,string *name,string *filename,string *contentType)

{
  FormPart::FormPart(&this->super_FormPart,name);
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__File_00134bb0;
  std::__cxx11::string::string((string *)&this->mFilename,(string *)filename);
  std::__cxx11::string::string((string *)&this->mContentType,(string *)contentType);
  return;
}

Assistant:

curlpp::FormParts::File::File(const std::string & name, 
			      const std::string & filename,
			      const std::string & contentType)
  : FormPart(name)
  , mFilename(filename)
  , mContentType(contentType)
{}